

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_strifeweapons.cpp
# Opt level: O2

int ASigil::GiveSigilPiece(AActor *receiver)

{
  TObjPtr<AActor> *obj;
  uint uVar1;
  bool bVar2;
  ASigil *pAVar3;
  AActor *pAVar4;
  AInventory *this;
  ulong uVar5;
  int iVar6;
  FName local_1c;
  
  pAVar3 = AActor::FindInventory<ASigil>(receiver);
  if (pAVar3 == (ASigil *)0x0) {
    FName::FName(&local_1c,"Sigil1");
    this = (AInventory *)Spawn(&local_1c);
    iVar6 = 0;
    bVar2 = AInventory::CallTryPickup(this,receiver,(AActor **)0x0);
    if (!bVar2) {
      (*(this->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])(this);
    }
  }
  else {
    uVar1 = *(uint *)&(pAVar3->super_AWeapon).field_0x584;
    if ((int)uVar1 < 5) {
      uVar5 = 0;
      if (0 < (int)uVar1) {
        uVar5 = (ulong)uVar1;
      }
      *(uint *)&(pAVar3->super_AWeapon).field_0x584 = uVar1 + 1;
      pAVar4 = GetDefaultByName((char *)((long)&_ZZN6ASigil14GiveSigilPieceEP6AActorE6sigils_rel +
                                        (long)(int)(&
                                                  _ZZN6ASigil14GiveSigilPieceEP6AActorE6sigils_rel)
                                                  [uVar5]));
      (pAVar3->super_AWeapon).super_AInventory.Icon.texnum =
           *(int *)&pAVar4[1].super_DThinker.super_DObject.GCNext;
      obj = &(pAVar3->super_AWeapon).super_AInventory.Owner;
      pAVar4 = GC::ReadBarrier<AActor>((AActor **)obj);
      if (pAVar4->player != (player_t *)0x0) {
        pAVar4 = GC::ReadBarrier<AActor>((AActor **)obj);
        if ((ASigil *)pAVar4->player->ReadyWeapon == pAVar3) {
          pAVar4 = GC::ReadBarrier<AActor>((AActor **)obj);
          pAVar4->player->PendingWeapon = &pAVar3->super_AWeapon;
          pAVar3->DownPieces = *(int *)&(pAVar3->super_AWeapon).field_0x584 + -1;
        }
      }
      iVar6 = *(int *)&(pAVar3->super_AWeapon).field_0x584 + -1;
    }
    else {
      iVar6 = 5;
    }
  }
  return iVar6;
}

Assistant:

int ASigil::GiveSigilPiece (AActor *receiver)
{
	ASigil *sigil;

	sigil = receiver->FindInventory<ASigil> ();
	if (sigil == NULL)
	{
		sigil = static_cast<ASigil*>(Spawn("Sigil1"));
		if (!sigil->CallTryPickup (receiver))
		{
			sigil->Destroy ();
		}
		return 0;
	}
	else if (sigil->NumPieces < 5)
	{
		++sigil->NumPieces;
		static const char* sigils[5] =
		{
			"Sigil1", "Sigil2", "Sigil3", "Sigil4", "Sigil5"
		};
		sigil->Icon = ((AInventory*)GetDefaultByName (sigils[MAX(0,sigil->NumPieces-1)]))->Icon;
		// If the player has the Sigil out, drop it and bring it back up.
		if (sigil->Owner->player != NULL && sigil->Owner->player->ReadyWeapon == sigil)
		{
			sigil->Owner->player->PendingWeapon = sigil;
			sigil->DownPieces = sigil->NumPieces - 1;
		}
		return sigil->NumPieces - 1;
	}
	else
	{
		return 5;
	}
}